

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O3

void Macro_smpsMaxRelRate(uint arg_count,long *arg_array)

{
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  if (2 < target_driver) {
    local_18 = 0x88;
    local_10 = 0xf;
    Macro_smpsFMICommand((uint)&local_18,arg_array);
    local_28 = 0x8c;
    local_20 = 0xf;
    Macro_smpsFMICommand((uint)&local_28,arg_array);
    return;
  }
  MemoryStream_WriteByte(output_stream,0xf9);
  return;
}

Assistant:

static void Macro_smpsMaxRelRate(unsigned int arg_count, long arg_array[])
{
	(void)arg_count;
	(void)arg_array;

	if (target_driver >= 3)
	{
		Macro_smpsFMICommand(2, (long[]){0x88, 0x0F});
		Macro_smpsFMICommand(2, (long[]){0x8C, 0x0F});
	}
	else
	{
		WriteByte(0xF9);
	}
}